

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

UBool __thiscall
icu_63::OlsonTimeZone::getPreviousTransition
          (OlsonTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  TimeArrayTimeZoneRule *this_00;
  TimeArrayTimeZoneRule *this_01;
  TimeZoneTransition *pTVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  UDate UVar6;
  double dVar7;
  undefined1 local_d8 [8];
  UnicodeString toName;
  UnicodeString fromName;
  UDate startTime;
  TimeZoneRule *from;
  TimeZoneRule *to;
  UDate t;
  int16_t ttidx;
  TimeZoneTransition *pTStack_30;
  UErrorCode status;
  TimeZoneTransition *result_local;
  UDate UStack_20;
  UBool inclusive_local;
  UDate base_local;
  OlsonTimeZone *this_local;
  
  t._4_4_ = U_ZERO_ERROR;
  pTStack_30 = result;
  result_local._7_1_ = inclusive;
  UStack_20 = base;
  base_local = (UDate)this;
  checkTransitionRules(this,(UErrorCode *)((long)&t + 4));
  UVar2 = ::U_FAILURE(t._4_4_);
  dVar7 = UStack_20;
  if (UVar2 != '\0') {
    return '\0';
  }
  if (this->finalZone != (SimpleTimeZone *)0x0) {
    if (result_local._7_1_ != '\0') {
      UVar6 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
      if ((dVar7 == UVar6) && (!NAN(dVar7) && !NAN(UVar6))) {
        TimeZoneTransition::operator=(pTStack_30,this->firstFinalTZTransition);
        return '\x01';
      }
    }
    dVar7 = UStack_20;
    UVar6 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
    if (UVar6 < dVar7) {
      iVar3 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9]
              )();
      if ((char)iVar3 != '\0') {
        iVar3 = (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject.
                  _vptr_UObject[0xf])
                          (UStack_20,this->finalZoneWithStartYear,
                           (ulong)(uint)(int)result_local._7_1_,pTStack_30,
                           CONCAT71((int7)((ulong)in_RCX >> 8),result_local._7_1_));
        return (UBool)iVar3;
      }
      TimeZoneTransition::operator=(pTStack_30,this->firstFinalTZTransition);
      return '\x01';
    }
  }
  if (this->historicRules == (TimeArrayTimeZoneRule **)0x0) {
    return '\0';
  }
  t._2_2_ = transitionCount(this);
  do {
    do {
      t._2_2_ = t._2_2_ + -1;
      if ((t._2_2_ < this->firstTZTransitionIdx) ||
         (dVar7 = transitionTime(this,t._2_2_), dVar7 < UStack_20)) goto LAB_002c716a;
    } while (result_local._7_1_ == '\0');
  } while ((UStack_20 != dVar7) || (NAN(UStack_20) || NAN(dVar7)));
LAB_002c716a:
  if (t._2_2_ < this->firstTZTransitionIdx) {
    return '\0';
  }
  if (t._2_2_ == this->firstTZTransitionIdx) {
    TimeZoneTransition::operator=(pTStack_30,this->firstTZTransition);
    return '\x01';
  }
  this_00 = this->historicRules[this->typeMapData[t._2_2_]];
  this_01 = this->historicRules[this->typeMapData[(long)t._2_2_ + -1]];
  dVar7 = transitionTime(this,t._2_2_);
  icu_63::UnicodeString::UnicodeString((UnicodeString *)((long)&toName.fUnion + 0x30));
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_d8);
  TimeZoneRule::getName(&this_01->super_TimeZoneRule,(UnicodeString *)((long)&toName.fUnion + 0x30))
  ;
  TimeZoneRule::getName(&this_00->super_TimeZoneRule,(UnicodeString *)local_d8);
  UVar2 = icu_63::UnicodeString::operator==
                    ((UnicodeString *)((long)&toName.fUnion + 0x30),(UnicodeString *)local_d8);
  if (UVar2 != '\0') {
    iVar4 = TimeZoneRule::getRawOffset(&this_01->super_TimeZoneRule);
    iVar5 = TimeZoneRule::getRawOffset(&this_00->super_TimeZoneRule);
    if (iVar4 == iVar5) {
      iVar4 = TimeZoneRule::getDSTSavings(&this_01->super_TimeZoneRule);
      iVar5 = TimeZoneRule::getDSTSavings(&this_00->super_TimeZoneRule);
      if (iVar4 == iVar5) {
        iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xf])
                          (dVar7,this,0,pTStack_30);
        this_local._7_1_ = (UBool)iVar3;
        goto LAB_002c73db;
      }
    }
  }
  TimeZoneTransition::setTime(pTStack_30,dVar7);
  pTVar1 = pTStack_30;
  iVar3 = (*(this_01->super_TimeZoneRule).super_UObject._vptr_UObject[3])();
  TimeZoneTransition::adoptFrom(pTVar1,(TimeZoneRule *)CONCAT44(extraout_var,iVar3));
  pTVar1 = pTStack_30;
  iVar3 = (*(this_00->super_TimeZoneRule).super_UObject._vptr_UObject[3])();
  TimeZoneTransition::adoptTo(pTVar1,(TimeZoneRule *)CONCAT44(extraout_var_00,iVar3));
  this_local._7_1_ = '\x01';
LAB_002c73db:
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_d8);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&toName.fUnion + 0x30));
  return this_local._7_1_;
}

Assistant:

UBool
OlsonTimeZone::getPreviousTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    if (finalZone != NULL) {
        if (inclusive && base == firstFinalTZTransition->getTime()) {
            result = *firstFinalTZTransition;
            return TRUE;
        } else if (base > firstFinalTZTransition->getTime()) {
            if (finalZone->useDaylightTime()) {
                //return finalZone->getPreviousTransition(base, inclusive, result);
                return finalZoneWithStartYear->getPreviousTransition(base, inclusive, result);
            } else {
                result = *firstFinalTZTransition;
                return TRUE;
            }
        }
    }

    if (historicRules != NULL) {
        // Find a historical transition
        int16_t ttidx = transitionCount() - 1;
        for (; ttidx >= firstTZTransitionIdx; ttidx--) {
            UDate t = (UDate)transitionTime(ttidx);
            if (base > t || (inclusive && base == t)) {
                break;
            }
        }
        if (ttidx < firstTZTransitionIdx) {
            // No more transitions
            return FALSE;
        } else if (ttidx == firstTZTransitionIdx) {
            result = *firstTZTransition;
            return TRUE;
        } else {
            // Create a TimeZoneTransition
            TimeZoneRule *to = historicRules[typeMapData[ttidx]];
            TimeZoneRule *from = historicRules[typeMapData[ttidx-1]];
            UDate startTime = (UDate)transitionTime(ttidx);

            // The transitions loaded from zoneinfo.res may contain non-transition data
            UnicodeString fromName, toName;
            from->getName(fromName);
            to->getName(toName);
            if (fromName == toName && from->getRawOffset() == to->getRawOffset()
                    && from->getDSTSavings() == to->getDSTSavings()) {
                return getPreviousTransition(startTime, false, result);
            }
            result.setTime(startTime);
            result.adoptFrom(from->clone());
            result.adoptTo(to->clone());
            return TRUE;
        }
    }
    return FALSE;
}